

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetWritable
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  DynamicTypeHandler *pDVar7;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_50;
  SimpleDictionaryPropertyDescriptor<int> *local_48;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7cd,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_48);
  if (bVar3) {
    iVar5 = 1;
    if ((local_48->Attributes & 0x10) == 0) {
      propertyRecord = (PropertyRecord *)(instance->super_RecyclableObject).type.ptr;
      if (value == 0) {
        BVar4 = ClearAttribute(this,instance,local_48,'\x04');
        if (BVar4 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
          pDVar7 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
          pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
          WriteBarrierSet(&local_50,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                    (local_50.ptr,pDVar7,'\0',propertyId,
                     (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr);
        }
      }
      else {
        BVar4 = SetAttribute(this,instance,local_48,'\x04');
        if (BVar4 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
        }
      }
    }
  }
  else {
    bVar3 = DynamicObject::HasObjectArray(instance);
    iVar5 = 1;
    if ((bVar3) && (*(char *)(descriptor + 2) == '\x01')) {
      pDVar7 = ConvertToTypeWithItemAttributes(this,instance);
      iVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar7,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
    }
  }
  return iVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler *const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }